

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# earcut.hpp
# Opt level: O0

Node * __thiscall
mapbox::detail::Earcut<unsigned_int>::cureLocalIntersections(Earcut<unsigned_int> *this,Node *start)

{
  bool bVar1;
  Node *pNVar2;
  Earcut<unsigned_int> *in_RSI;
  Earcut<unsigned_int> *in_RDI;
  Node *b;
  Node *a;
  Node *p;
  Earcut<unsigned_int> *p2;
  Earcut<unsigned_int> *this_00;
  Earcut<unsigned_int> *this_01;
  Earcut<unsigned_int> *this_02;
  
  this_01 = in_RSI;
  this_02 = in_RDI;
  do {
    this_00 = (Earcut<unsigned_int> *)in_RSI->vertices;
    p2 = (Earcut<unsigned_int> *)(*(Node **)&in_RSI->hashing)->next;
    bVar1 = equals(in_RDI,(Node *)this_00,(Node *)p2);
    if ((((!bVar1) &&
         (bVar1 = intersects(this_02,(Node *)this_01,(Node *)in_RSI,(Node *)this_00,(Node *)p2),
         bVar1)) && (bVar1 = locallyInside(this_00,(Node *)p2,(Node *)in_RDI), bVar1)) &&
       (bVar1 = locallyInside(this_00,(Node *)p2,(Node *)in_RDI), bVar1)) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::emplace_back<unsigned_int_const&>
                (&this_00->indices,(uint *)p2);
      std::vector<unsigned_int,std::allocator<unsigned_int>>::emplace_back<unsigned_int_const&>
                (&this_00->indices,(uint *)p2);
      std::vector<unsigned_int,std::allocator<unsigned_int>>::emplace_back<unsigned_int_const&>
                (&this_00->indices,(uint *)p2);
      removeNode(in_RDI,(Node *)in_RSI);
      removeNode(in_RDI,*(Node **)&in_RSI->hashing);
      in_RSI = p2;
      this_01 = p2;
    }
    in_RSI = *(Earcut<unsigned_int> **)&in_RSI->hashing;
  } while (in_RSI != this_01);
  pNVar2 = filterPoints(this_01,(Node *)in_RSI,(Node *)this_00);
  return pNVar2;
}

Assistant:

typename Earcut<N>::Node*
Earcut<N>::cureLocalIntersections(Node* start) {
    Node* p = start;
    do {
        Node* a = p->prev;
        Node* b = p->next->next;

        // a self-intersection where edge (v[i-1],v[i]) intersects (v[i+1],v[i+2])
        if (!equals(a, b) && intersects(a, p, p->next, b) && locallyInside(a, b) && locallyInside(b, a)) {
            indices.emplace_back(a->i);
            indices.emplace_back(p->i);
            indices.emplace_back(b->i);

            // remove two nodes involved
            removeNode(p);
            removeNode(p->next);

            p = start = b;
        }
        p = p->next;
    } while (p != start);

    return filterPoints(p);
}